

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O3

asn_enc_rval_t *
OCTET_STRING_encode_uper
          (asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,
          asn_per_constraints_t *constraints,void *sptr,asn_per_outp_t *po)

{
  asn_per_constraint_flags aVar1;
  bool bVar2;
  asn_per_constraints_t *paVar3;
  int iVar4;
  asn_per_constraint_s *paVar5;
  ulong units;
  ssize_t sVar6;
  asn_OCTET_STRING_specifics_t *paVar7;
  ulong uVar8;
  uint uVar9;
  uint8_t *buf;
  uint32_t bits;
  asn_per_constraints_t *paVar10;
  uint unit_bits;
  uint uVar11;
  uint local_60;
  int iVar12;
  
  paVar7 = &asn_DEF_OCTET_STRING_specs;
  if ((asn_OCTET_STRING_specifics_t *)td->specifics != (asn_OCTET_STRING_specifics_t *)0x0) {
    paVar7 = (asn_OCTET_STRING_specifics_t *)td->specifics;
  }
  if (constraints == (asn_per_constraints_t *)0x0) {
    constraints = td->per_constraints;
  }
  if ((sptr != (void *)0x0) && ((*sptr != 0 || (*(int *)((long)sptr + 8) == 0)))) {
    paVar10 = constraints;
    if (constraints == (asn_per_constraints_t *)0x0) {
      paVar10 = &asn_DEF_OCTET_STRING_constraints;
    }
    paVar3 = constraints;
    if (constraints == (asn_per_constraints_t *)0x0) {
      paVar3 = &asn_DEF_OCTET_STRING_constraints;
    }
    paVar5 = &paVar3->size;
    switch(paVar7->subvariant) {
    case ASN_OSUBV_BIT:
      uVar11 = *(int *)((long)sptr + 8) * 8 - (*(uint *)((long)sptr + 0xc) & 7);
      local_60 = 0;
      bVar2 = true;
      unit_bits = 1;
      uVar9 = 1;
      goto LAB_00148113;
    case ASN_OSUBV_STR:
      uVar9 = 8;
      unit_bits = 8;
      if (((paVar10->value).flags & APC_CONSTRAINED) != APC_UNCONSTRAINED) {
        unit_bits = (paVar10->value).range_bits;
      }
      uVar11 = *(uint *)((long)sptr + 8);
      local_60 = 1;
      break;
    case ASN_OSUBV_U16:
      uVar9 = 0x10;
      unit_bits = 0x10;
      if (((paVar10->value).flags & APC_CONSTRAINED) != APC_UNCONSTRAINED) {
        unit_bits = (paVar10->value).range_bits;
      }
      uVar11 = *(int *)((long)sptr + 8) / 2;
      local_60 = 2;
      break;
    case ASN_OSUBV_U32:
      uVar9 = 0x20;
      unit_bits = 0x20;
      if (((paVar10->value).flags & APC_CONSTRAINED) != APC_UNCONSTRAINED) {
        unit_bits = (paVar10->value).range_bits;
      }
      iVar4 = *(int *)((long)sptr + 8);
      iVar12 = iVar4 + 3;
      if (-1 < iVar4) {
        iVar12 = iVar4;
      }
      uVar11 = iVar12 >> 2;
      local_60 = 4;
      break;
    default:
      goto switchD_0014804d_default;
    }
    bVar2 = false;
LAB_00148113:
    aVar1 = (paVar10->size).flags;
    iVar4 = paVar5->effective_bits;
    if ((iVar4 < 0) ||
       ((paVar5->lower_bound <= (long)(int)uVar11 && ((long)(int)uVar11 <= paVar5->upper_bound)))) {
      bits = 0;
      if ((aVar1 & APC_EXTENSIBLE) != APC_UNCONSTRAINED) {
LAB_00148148:
        iVar4 = per_put_few_bits(po,bits,1);
        if (iVar4 != 0) goto switchD_0014804d_default;
        iVar4 = paVar5->effective_bits;
      }
      if (iVar4 < 0) {
        if (uVar11 != 0) {
          buf = *sptr;
          do {
            units = uper_put_length(po,(ulong)uVar11);
            if ((long)units < 0) {
LAB_001482b4:
              __return_storage_ptr__->encoded = -1;
              __return_storage_ptr__->failed_type = td;
              __return_storage_ptr__->structure_ptr = sptr;
              return __return_storage_ptr__;
            }
            if (bVar2) {
              iVar4 = per_put_many_bits(po,buf,unit_bits * (int)units);
            }
            else {
              iVar4 = OCTET_STRING_per_put_characters
                                (po,buf,units,local_60,unit_bits,(paVar10->value).lower_bound,
                                 (paVar10->value).upper_bound,constraints);
            }
            if (iVar4 != 0) goto LAB_001482b4;
            uVar8 = units >> 3;
            if (!bVar2) {
              uVar8 = units * local_60;
            }
            buf = buf + uVar8;
            uVar11 = uVar11 - (int)units;
          } while (uVar11 != 0);
LAB_00148321:
          __return_storage_ptr__->encoded = 0;
          __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
          __return_storage_ptr__->structure_ptr = (void *)0x0;
          return __return_storage_ptr__;
        }
        sVar6 = uper_put_length(po,0);
        if (sVar6 == 0) goto LAB_00148321;
        __return_storage_ptr__->encoded = -1;
        __return_storage_ptr__->failed_type = td;
        goto LAB_00148175;
      }
      iVar4 = per_put_few_bits(po,uVar11 - (int)paVar5->lower_bound,iVar4);
      if (iVar4 != 0) {
        __return_storage_ptr__->encoded = -1;
        __return_storage_ptr__->failed_type = td;
        __return_storage_ptr__->structure_ptr = sptr;
        return __return_storage_ptr__;
      }
      if (bVar2) {
        iVar4 = per_put_many_bits(po,*sptr,unit_bits * uVar11);
      }
      else {
        iVar4 = OCTET_STRING_per_put_characters
                          (po,*sptr,(ulong)uVar11,local_60,unit_bits,(paVar10->value).lower_bound,
                           (paVar10->value).upper_bound,constraints);
      }
      if (iVar4 == 0) goto LAB_00148321;
    }
    else {
      bits = 1;
      paVar10 = &asn_DEF_OCTET_STRING_constraints;
      paVar5 = &asn_DEF_OCTET_STRING_constraints.size;
      unit_bits = uVar9;
      if ((aVar1 & APC_EXTENSIBLE) != APC_UNCONSTRAINED) goto LAB_00148148;
    }
  }
switchD_0014804d_default:
  __return_storage_ptr__->encoded = -1;
  __return_storage_ptr__->failed_type = td;
LAB_00148175:
  __return_storage_ptr__->structure_ptr = sptr;
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
OCTET_STRING_encode_uper(asn_TYPE_descriptor_t *td,
        asn_per_constraints_t *constraints, void *sptr, asn_per_outp_t *po) {

	asn_OCTET_STRING_specifics_t *specs = td->specifics
		? (asn_OCTET_STRING_specifics_t *)td->specifics
		: &asn_DEF_OCTET_STRING_specs;
	asn_per_constraints_t *pc = constraints ? constraints
				: td->per_constraints;
	asn_per_constraint_t *cval;
	asn_per_constraint_t *csiz;
	const BIT_STRING_t *st = (const BIT_STRING_t *)sptr;
	asn_enc_rval_t er = { 0, 0, 0 };
	int inext = 0;		/* Lies not within extension root */
	unsigned int unit_bits;
	unsigned int canonical_unit_bits;
	unsigned int sizeinunits;
	const uint8_t *buf;
	int ret;
	enum {
		OS__BPC_BIT	= 0,
		OS__BPC_CHAR	= 1,
		OS__BPC_U16	= 2,
		OS__BPC_U32	= 4
	} bpc;	/* Bytes per character */
	int ct_extensible;

	if(!st || (!st->buf && st->size))
		ASN__ENCODE_FAILED;

	if(pc) {
		cval = &pc->value;
		csiz = &pc->size;
	} else {
		cval = &asn_DEF_OCTET_STRING_constraints.value;
		csiz = &asn_DEF_OCTET_STRING_constraints.size;
	}
	ct_extensible = csiz->flags & APC_EXTENSIBLE;

	switch(specs->subvariant) {
	default:
	case ASN_OSUBV_ANY:
		ASN__ENCODE_FAILED;
	case ASN_OSUBV_BIT:
		canonical_unit_bits = unit_bits = 1;
		bpc = OS__BPC_BIT;
		sizeinunits = st->size * 8 - (st->bits_unused & 0x07);
		ASN_DEBUG("BIT STRING of %d bytes, %d bits unused",
				sizeinunits, st->bits_unused);
		break;
	case ASN_OSUBV_STR:
		canonical_unit_bits = unit_bits = 8;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_CHAR;
		sizeinunits = st->size;
		break;
	case ASN_OSUBV_U16:
		canonical_unit_bits = unit_bits = 16;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_U16;
		sizeinunits = st->size / 2;
		break;
	case ASN_OSUBV_U32:
		canonical_unit_bits = unit_bits = 32;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_U32;
		sizeinunits = st->size / 4;
		break;
	}

	ASN_DEBUG("Encoding %s into %d units of %d bits"
		" (%ld..%ld, effective %d)%s",
		td->name, sizeinunits, unit_bits,
		csiz->lower_bound, csiz->upper_bound,
		csiz->effective_bits, ct_extensible ? " EXT" : "");

	/* Figure out whether size lies within PER visible constraint */

	if(csiz->effective_bits >= 0) {
		if((int)sizeinunits < csiz->lower_bound
		|| (int)sizeinunits > csiz->upper_bound) {
			if(ct_extensible) {
				cval = &asn_DEF_OCTET_STRING_constraints.value;
				csiz = &asn_DEF_OCTET_STRING_constraints.size;
				unit_bits = canonical_unit_bits;
				inext = 1;
			} else
				ASN__ENCODE_FAILED;
		}
	} else {
		inext = 0;
	}

	if(ct_extensible) {
		/* Declare whether length is [not] within extension root */
		if(per_put_few_bits(po, inext, 1))
			ASN__ENCODE_FAILED;
	}

	/* X.691, #16.5: zero-length encoding */
	/* X.691, #16.6: short fixed length encoding (up to 2 octets) */
	/* X.691, #16.7: long fixed length encoding (up to 64K octets) */
	if(csiz->effective_bits >= 0) {
		ASN_DEBUG("Encoding %d bytes (%ld), length in %d bits",
				st->size, sizeinunits - csiz->lower_bound,
				csiz->effective_bits);
		ret = per_put_few_bits(po, sizeinunits - csiz->lower_bound,
				csiz->effective_bits);
		if(ret) ASN__ENCODE_FAILED;
		if(bpc) {
			ret = OCTET_STRING_per_put_characters(po, st->buf,
				sizeinunits, bpc, unit_bits,
				cval->lower_bound, cval->upper_bound, pc);
		} else {
			ret = per_put_many_bits(po, st->buf,
				sizeinunits * unit_bits);
		}
		if(ret) ASN__ENCODE_FAILED;
		ASN__ENCODED_OK(er);
	}

	ASN_DEBUG("Encoding %d bytes", st->size);

	if(sizeinunits == 0) {
		if(uper_put_length(po, 0))
			ASN__ENCODE_FAILED;
		ASN__ENCODED_OK(er);
	}

	buf = st->buf;
	while(sizeinunits) {
		ssize_t maySave = uper_put_length(po, sizeinunits);
		if(maySave < 0) ASN__ENCODE_FAILED;

		ASN_DEBUG("Encoding %ld of %ld",
			(long)maySave, (long)sizeinunits);

		if(bpc) {
			ret = OCTET_STRING_per_put_characters(po, buf,
				maySave, bpc, unit_bits,
				cval->lower_bound, cval->upper_bound, pc);
		} else {
			ret = per_put_many_bits(po, buf, maySave * unit_bits);
		}
		if(ret) ASN__ENCODE_FAILED;

		if(bpc)
			buf += maySave * bpc;
		else
			buf += maySave >> 3;
		sizeinunits -= maySave;
		assert(!(maySave & 0x07) || !sizeinunits);
	}

	ASN__ENCODED_OK(er);
}